

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O3

int rc2_ctrl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  int *piVar1;
  int iVar2;
  
  piVar1 = (int *)ctx->cipher_data;
  if (type != 3) {
    if (type != 0) {
      return -1;
    }
    iVar2 = EVP_CIPHER_CTX_key_length((EVP_CIPHER_CTX *)ctx);
    arg = iVar2 << 3;
  }
  *piVar1 = arg;
  return 1;
}

Assistant:

static int rc2_ctrl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr) {
  EVP_RC2_KEY *key = (EVP_RC2_KEY *)ctx->cipher_data;

  switch (type) {
    case EVP_CTRL_INIT:
      key->key_bits = EVP_CIPHER_CTX_key_length(ctx) * 8;
      return 1;
    case EVP_CTRL_SET_RC2_KEY_BITS:
      // Should be overridden by later call to |EVP_CTRL_INIT|, but
      // people call it, so it may as well work.
      key->key_bits = arg;
      return 1;

    default:
      return -1;
  }
}